

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_sssub32_x86_64(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  intptr_t oprsz_00;
  bool bVar2;
  uint local_44;
  int32_t di;
  int32_t bi;
  int32_t ai;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (_bi = 0; _bi < oprsz_00; _bi = _bi + 4) {
    uVar1 = *(uint *)((long)a + _bi);
    local_44 = uVar1 - *(uint *)((long)b + _bi);
    if (((int)((local_44 ^ uVar1) & (uVar1 ^ *(uint *)((long)b + _bi))) < 0) &&
       (bVar2 = (int)local_44 < 0, local_44 = 0x80000000, bVar2)) {
      local_44 = 0x7fffffff;
    }
    *(uint *)((long)d + _bi) = local_44;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_sssub32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int32_t)) {
        int32_t ai = *(int32_t *)((char *)a + i);
        int32_t bi = *(int32_t *)((char *)b + i);
        int32_t di = ai - bi;
        if (((di ^ ai) & (ai ^ bi)) < 0) {
            /* Signed overflow.  */
            di = (di < 0 ? INT32_MAX : INT32_MIN);
        }
        *(int32_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}